

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

void __thiscall
QFSFileEnginePrivate::QFSFileEnginePrivate(QFSFileEnginePrivate *this,QAbstractFileEngine *q)

{
  (this->super_QAbstractFileEnginePrivate).fileError = UnspecifiedError;
  (this->super_QAbstractFileEnginePrivate).errorString.d.d = (Data *)0x0;
  (this->super_QAbstractFileEnginePrivate).errorString.d.ptr = (char16_t *)0x0;
  (this->super_QAbstractFileEnginePrivate).errorString.d.size = 0;
  (this->super_QAbstractFileEnginePrivate).q_ptr = q;
  (this->super_QAbstractFileEnginePrivate)._vptr_QAbstractFileEnginePrivate =
       (_func_int **)&PTR__QFSFileEnginePrivate_001884d0;
  QFileSystemEntry::QFileSystemEntry(&this->fileEntry);
  (this->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
  (this->metaData).knownFlagsMask = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (this->metaData).entryFlags = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (this->metaData).size_ = -1;
  (this->metaData).accessTime_ = 0;
  (this->metaData).birthTime_ = 0;
  (this->metaData).metadataChangeTime_ = 0;
  (this->metaData).modificationTime_ = 0;
  (this->metaData).userId_ = 0xfffffffe;
  (this->metaData).groupId_ = 0xfffffffe;
  (this->maps).d = (Data *)0x0;
  init(this,(EVP_PKEY_CTX *)q);
  return;
}

Assistant:

QFSFileEnginePrivate::QFSFileEnginePrivate(QAbstractFileEngine *q)
    : QAbstractFileEnginePrivate(q)
{
    init();
}